

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listimagewindow.cc
# Opt level: O0

void __thiscall bgui::ListImageWindow::set(ListImageWindow *this,int pos,int w,int h,bool size_max)

{
  ImageAdapterBase *this_00;
  size_type sVar1;
  reference ppIVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  ImageAdapterBase *adapt;
  int in_stack_00000038;
  int in_stack_0000003c;
  keep in_stack_00000040;
  bool in_stack_00000047;
  ImageAdapterBase *in_stack_00000048;
  ImageWindow *in_stack_00000050;
  ListImageWindow *in_stack_00000210;
  
  if ((-1 < in_ESI) &&
     (sVar1 = std::vector<bgui::ImageAdapterBase_*,_std::allocator<bgui::ImageAdapterBase_*>_>::size
                        ((vector<bgui::ImageAdapterBase_*,_std::allocator<bgui::ImageAdapterBase_*>_>
                          *)(in_RDI + 0x70)), in_ESI < (int)sVar1)) {
    ppIVar2 = std::vector<bgui::ImageAdapterBase_*,_std::allocator<bgui::ImageAdapterBase_*>_>::
              operator[]((vector<bgui::ImageAdapterBase_*,_std::allocator<bgui::ImageAdapterBase_*>_>
                          *)(in_RDI + 0x70),(long)in_ESI);
    this_00 = *ppIVar2;
    if ((*(double *)(in_RDI + 0x90) < *(double *)(in_RDI + 0x98)) && (*(int *)(in_RDI + 0xb0) == 2))
    {
      ImageAdapterBase::setMinIntensity(this_00,*(double *)(in_RDI + 0x90));
      ImageAdapterBase::setMaxIntensity(this_00,*(double *)(in_RDI + 0x98));
    }
    if ((in_EDX < 1) || (in_ECX < 1)) {
      if (*(int *)(in_RDI + 0xb0) == 0) {
        ImageAdapterBase::setMapping(this_00,*(mapping *)(in_RDI + 0xb4));
        ImageAdapterBase::setChannel(this_00,*(int *)(in_RDI + 0xb8));
      }
      ImageWindow::setAdapter
                (in_stack_00000050,in_stack_00000048,in_stack_00000047,in_stack_00000040,
                 in_stack_0000003c,in_stack_00000038,this._7_1_);
    }
    else {
      ImageAdapterBase::setMapping(this_00,*(mapping *)(in_RDI + 0xb4));
      ImageAdapterBase::setChannel(this_00,*(int *)(in_RDI + 0xb8));
      ImageWindow::setAdapter
                (in_stack_00000050,in_stack_00000048,in_stack_00000047,in_stack_00000040,
                 in_stack_0000003c,in_stack_00000038,this._7_1_);
    }
  }
  updateTitle(in_stack_00000210);
  return;
}

Assistant:

void ListImageWindow::set(int pos, int w, int h, bool size_max)
{
  if (pos >= 0 && pos < static_cast<int>(list.size()))
  {
    ImageAdapterBase *adapt=list[pos];

    if (imin < imax && kp == keep_all)
    {
      adapt->setMinIntensity(imin);
      adapt->setMaxIntensity(imax);
    }

    if (w > 0 && h > 0)
    {
      adapt->setMapping(map);
      adapt->setChannel(channel);
      setAdapter(adapt, false, keep_none, w, h, size_max);
    }
    else
    {
      if (kp == keep_none)
      {
        adapt->setMapping(map);
        adapt->setChannel(channel);
      }

      setAdapter(adapt, false, kp);
    }
  }

  updateTitle();
}